

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O2

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnLocalGetExpr
          (BinaryReaderInterp *this,Index param_1)

{
  Index val;
  Result RVar1;
  uint uVar2;
  Enum EVar3;
  ValueType VVar4;
  Enum op;
  Location loc_1;
  Location loc;
  Var local_78;
  
  val = TranslateLocalIndex(this,param_1);
  loc.field_1.field_0.last_column = 0;
  loc.filename._M_len = (this->filename_)._M_len;
  loc.filename._M_str = (this->filename_)._M_str;
  loc_1.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
       ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  loc_1.field_1.field_0.last_column = 0;
  loc_1.filename._M_len = (this->filename_)._M_len;
  loc_1.filename._M_str = (this->filename_)._M_str;
  loc.field_1.field_1.offset = loc_1.field_1.field_1.offset;
  Var::Var(&local_78,param_1,&loc_1);
  RVar1 = SharedValidator::OnLocalGet(&this->validator_,&loc,&local_78);
  Var::~Var(&local_78);
  if (RVar1.enum_ == Error) {
    EVar3 = Error;
  }
  else {
    VVar4 = FuncDesc::GetLocalType(this->func_,param_1);
    uVar2 = VVar4.enum_ + 0x17;
    if (uVar2 < 8) {
      op = *(Enum *)(&DAT_001f986c + (ulong)uVar2 * 4);
    }
    else {
      op = LocalGet;
    }
    Istream::Emit(this->istream_,op,val);
    EVar3 = Ok;
  }
  return (Result)EVar3;
}

Assistant:

Result BinaryReaderInterp::OnLocalGetExpr(Index local_index) {
  // Get the translated index before calling validator_.OnLocalGet because it
  // will update the type stack size. We need the index to be relative to the
  // old stack size.
  Index translated_local_index = TranslateLocalIndex(local_index);
  CHECK_RESULT(
      validator_.OnLocalGet(GetLocation(), Var(local_index, GetLocation())));

  Type type = func_->GetLocalType(local_index);
  if (type.IsRef()) {
    istream_.Emit(Opcode::InterpLocalGetRef, translated_local_index);
  } else {
    istream_.Emit(Opcode::LocalGet, translated_local_index);
  }
  return Result::Ok;
}